

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

uint __thiscall apngasm::APNGAsm::read_chunk(APNGAsm *this,FILE *f,CHUNK *pChunk)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uchar len [4];
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  sVar1 = fread(&local_24,4,1,(FILE *)f);
  uVar3 = 0;
  if (sVar1 == 1) {
    uVar4 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
            local_24 << 0x18;
    uVar3 = uVar4 + 0xc;
    pChunk->size = uVar3;
    puVar2 = (uint *)operator_new__((ulong)uVar3);
    pChunk->p = (uchar *)puVar2;
    *puVar2 = local_24;
    sVar1 = fread(puVar2 + 1,(ulong)(uVar4 + 8),1,(FILE *)f);
    uVar3 = 0;
    if (sVar1 == 1) {
      uVar3 = *(uint *)(pChunk->p + 4);
    }
  }
  return uVar3;
}

Assistant:

unsigned int APNGAsm::read_chunk(FILE * f, CHUNK * pChunk)
  {
    unsigned char len[4];
    if (fread(&len, 4, 1, f) == 1)
    {
      pChunk->size = png_get_uint_32(len) + 12;
      pChunk->p = new unsigned char[pChunk->size];
      memcpy(pChunk->p, len, 4);
      if (fread(pChunk->p + 4, pChunk->size - 4, 1, f) == 1)
        return *(unsigned int *)(pChunk->p + 4);
    }
    return 0;
  }